

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operation.cpp
# Opt level: O0

ptr<Value> __thiscall Operation::asStrings(Operation *this,string *leftOperand,string *rightOperand)

{
  ThrowPacket *this_00;
  allocator<char> local_59;
  string local_58;
  ptr<Value> local_38;
  string *rightOperand_local;
  string *leftOperand_local;
  Operation *this_local;
  
  rightOperand_local = rightOperand;
  leftOperand_local = leftOperand;
  this_local = this;
  this_00 = (ThrowPacket *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Operation not defined for String type",&local_59);
  ExceptionObjects::undefined_operation((ExceptionObjects *)&local_38,&local_58);
  ThrowPacket::ThrowPacket(this_00,&local_38);
  __cxa_throw(this_00,&ThrowPacket::typeinfo,ThrowPacket::~ThrowPacket);
}

Assistant:

ptr<Value> Operation::asStrings(const std::string &leftOperand, const std::string &rightOperand) {
    throw ThrowPacket(ExceptionObjects::undefined_operation("Operation not defined for String type"));
}